

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmake *this_00;
  PolicyStatus id_00;
  PolicyStatus extraout_EDX;
  PolicyStatus extraout_EDX_00;
  PolicyStatus extraout_EDX_01;
  PolicyStatus extraout_EDX_02;
  PolicyStatus extraout_EDX_03;
  PolicyStatus extraout_EDX_04;
  PolicyStatus extraout_EDX_05;
  bool local_e2;
  bool local_d1;
  string local_c0;
  byte local_9b;
  byte local_9a;
  allocator<char> local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  string msg;
  PolicyStatus status_local;
  PolicyID id_local;
  cmMakefile *this_local;
  
  msg.field_2._8_4_ = status;
  msg.field_2._12_4_ = id;
  if ((status == NEW) ||
     (PVar2 = cmPolicies::GetPolicyStatus(id), status = id_00, PVar2 != REQUIRED_ALWAYS)) {
    local_72 = 0;
    local_73 = 0;
    local_9a = 0;
    local_9b = 0;
    local_d1 = false;
    if ((msg.field_2._8_4_ == 0) && (local_d1 = false, (int)msg.field_2._12_4_ < 0x6d)) {
      this_00 = GetCMakeInstance(this);
      bVar1 = cmake::GetIsInTryCompile(this_00);
      if ((!bVar1) ||
         ((((local_d1 = false, status = extraout_EDX, msg.field_2._12_4_ != 0x41 &&
            (local_d1 = false, msg.field_2._12_4_ != 0x53)) &&
           (local_d1 = false, msg.field_2._12_4_ != 0x5b)) &&
          (local_d1 = false, msg.field_2._12_4_ != 0x68)))) {
        std::allocator<char>::allocator();
        local_72 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"CMAKE_WARN_DEPRECATED",&local_71);
        local_73 = 1;
        bVar1 = IsSet(this,&local_70);
        local_e2 = true;
        status = extraout_EDX_00;
        if (bVar1) {
          std::allocator<char>::allocator();
          local_9a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"CMAKE_WARN_DEPRECATED",&local_99);
          local_9b = 1;
          local_e2 = IsOn(this,&local_98);
          status = extraout_EDX_01;
        }
        local_d1 = local_e2;
      }
    }
    if ((local_9b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
      status = extraout_EDX_02;
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator(&local_99);
      status = extraout_EDX_03;
    }
    if ((local_73 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
      status = extraout_EDX_04;
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator(&local_71);
      status = extraout_EDX_05;
    }
    if (local_d1 != false) {
      cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_
                (&local_c0,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,status);
      IssueMessage(this,DEPRECATION_WARNING,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    cmStateSnapshot::SetPolicy(&this->StateSnapshot,msg.field_2._12_4_,msg.field_2._8_4_);
    this_local._7_1_ = true;
  }
  else {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
              ((string *)local_40,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,id_00);
    IssueMessage(this,FATAL_ERROR,(string *)local_40);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(MessageType::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0108 &&
      !(this->GetCMakeInstance()->GetIsInTryCompile() &&
        (
          // Policies set by cmCoreTryCompile::TryCompileCode.
          id == cmPolicies::CMP0065 || id == cmPolicies::CMP0083 ||
          id == cmPolicies::CMP0091 || id == cmPolicies::CMP0104)) &&
      (!this->IsSet("CMAKE_WARN_DEPRECATED") ||
       this->IsOn("CMAKE_WARN_DEPRECATED"))) {
    this->IssueMessage(MessageType::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}